

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

void __thiscall QTabBarPrivate::setupMovableTab(QTabBarPrivate *this)

{
  long lVar1;
  QWidget *pQVar2;
  Tab *pTVar3;
  qreal c;
  double dVar4;
  undefined1 auVar5 [12];
  int iVar6;
  QMovableTabWidget *this_00;
  QStyle *pQVar7;
  Representation RVar8;
  int iVar9;
  int iVar10;
  Representation RVar11;
  QRect *r;
  long in_FS_OFFSET;
  QRect QVar12;
  undefined1 *local_128;
  QWidget *pQStack_120;
  QStyle *local_118;
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  undefined1 local_e8 [8];
  int local_e0;
  Representation RStack_dc;
  QStyleOptionTab tab;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if (this->movingTab == (QMovableTabWidget *)0x0) {
    this_00 = (QMovableTabWidget *)operator_new(0x40);
    QMovableTabWidget::QMovableTabWidget(this_00,pQVar2);
    this->movingTab = this_00;
  }
  pQVar7 = QWidget::style(pQVar2);
  iVar6 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x13,0,pQVar2);
  QVar12 = QTabBar::tabRect((QTabBar *)pQVar2,this->pressedIndex);
  auVar5 = QVar12._0_12_;
  RVar11 = QVar12.y1.m_i;
  RVar8 = QVar12.y2.m_i;
  if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
    RVar11.m_i = RVar11.m_i - iVar6;
    _local_e0 = QVar12._8_8_;
    local_e8._4_4_ = RVar11.m_i;
    local_e8._0_4_ = QVar12.x1.m_i.m_i;
    RVar8.m_i = RVar8.m_i + iVar6;
    RStack_dc.m_i = RVar8.m_i;
  }
  else {
    local_e8._0_4_ = QVar12.x1.m_i.m_i - iVar6;
    auVar5._4_4_ = 0;
    auVar5._0_4_ = local_e8._0_4_;
    stack0xffffffffffffff1c = QVar12._4_12_;
    iVar10 = QVar12.x2.m_i.m_i + iVar6;
    auVar5._8_4_ = iVar10;
    local_e0 = iVar10;
    RStack_dc.m_i = RVar8.m_i;
  }
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
  local_128._0_4_ = (auVar5._8_4_ - auVar5._0_4_) + 1;
  local_128._4_4_ = (RVar8.m_i - RVar11.m_i) + 1;
  c = (qreal)QPaintDevice::devicePixelRatio();
  tab.super_QStyleOption._0_8_ = operator*((QSize *)&local_128,c);
  QPixmap::QPixmap((QPixmap *)&local_108,(QSize *)&tab);
  dVar4 = (double)QPaintDevice::devicePixelRatio();
  QPixmap::setDevicePixelRatio(dVar4);
  QColor::QColor((QColor *)&tab,transparent);
  QPixmap::fill((QColor *)&local_108);
  local_118 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_120 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)&local_128,(QPaintDevice *)&local_108,pQVar2);
  memset(&tab,0xaa,0xa0);
  QStyleOptionTab::QStyleOptionTab(&tab);
  (**(code **)(*(long *)pQVar2 + 0x1c8))(pQVar2,&tab,this->pressedIndex);
  tab.position = Moving;
  if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
    iVar9 = -tab.super_QStyleOption.rect.x1.m_i;
    tab.super_QStyleOption.rect.x1.m_i = 0;
    iVar10 = iVar6 - tab.super_QStyleOption.rect.y1.m_i;
    tab.super_QStyleOption.rect.y1.m_i = iVar6;
  }
  else {
    iVar9 = iVar6 - tab.super_QStyleOption.rect.x1.m_i;
    iVar10 = -tab.super_QStyleOption.rect.y1.m_i;
    tab.super_QStyleOption.rect.y1.m_i = 0;
    tab.super_QStyleOption.rect.x1.m_i = iVar6;
  }
  tab.super_QStyleOption.rect.y2.m_i = tab.super_QStyleOption.rect.y2.m_i + iVar10;
  tab.super_QStyleOption.rect.x2.m_i = tab.super_QStyleOption.rect.x2.m_i + iVar9;
  QStylePainter::drawControl((QStylePainter *)&local_128,CE_TabBarTab,&tab.super_QStyleOption);
  QPainter::end();
  QMovableTabWidget::setPixmap(this->movingTab,(QPixmap *)&local_108);
  r = (QRect *)local_e8;
  QWidget::setGeometry(&this->movingTab->super_QWidget,r);
  iVar6 = (int)r;
  QWidget::raise(&this->movingTab->super_QWidget,iVar6);
  pTVar3 = (this->tabList).d.ptr[this->pressedIndex];
  pQVar2 = pTVar3->leftWidget;
  if (pQVar2 != (QWidget *)0x0) {
    QWidget::raise(pQVar2,iVar6);
  }
  pQVar2 = pTVar3->rightWidget;
  if (pQVar2 != (QWidget *)0x0) {
    QWidget::raise(pQVar2,iVar6);
  }
  if ((QWidget *)this->leftB != (QWidget *)0x0) {
    QWidget::raise((QWidget *)this->leftB,iVar6);
  }
  if ((QWidget *)this->rightB != (QWidget *)0x0) {
    QWidget::raise((QWidget *)this->rightB,iVar6);
  }
  (**(code **)(*(long *)&this->movingTab->super_QWidget + 0x68))(this->movingTab,1);
  QStyleOptionTab::~QStyleOptionTab(&tab);
  QPainter::~QPainter((QPainter *)&local_128);
  QPixmap::~QPixmap((QPixmap *)&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBarPrivate::setupMovableTab()
{
    Q_Q(QTabBar);
    if (!movingTab)
        movingTab = new QMovableTabWidget(q);

    int taboverlap = q->style()->pixelMetric(QStyle::PM_TabBarTabOverlap, nullptr ,q);
    QRect grabRect = q->tabRect(pressedIndex);
    if (verticalTabs(shape))
        grabRect.adjust(0, -taboverlap, 0, taboverlap);
    else
        grabRect.adjust(-taboverlap, 0, taboverlap, 0);

    QPixmap grabImage(grabRect.size() * q->devicePixelRatio());
    grabImage.setDevicePixelRatio(q->devicePixelRatio());
    grabImage.fill(Qt::transparent);
    QStylePainter p(&grabImage, q);

    QStyleOptionTab tab;
    q->initStyleOption(&tab, pressedIndex);
    tab.position = QStyleOptionTab::Moving;
    if (verticalTabs(shape))
        tab.rect.moveTopLeft(QPoint(0, taboverlap));
    else
        tab.rect.moveTopLeft(QPoint(taboverlap, 0));
    p.drawControl(QStyle::CE_TabBarTab, tab);
    p.end();

    movingTab->setPixmap(grabImage);
    movingTab->setGeometry(grabRect);
    movingTab->raise();

    // Re-arrange widget order to avoid overlaps
    const auto &pressedTab = *tabList.at(pressedIndex);
    if (pressedTab.leftWidget)
        pressedTab.leftWidget->raise();
    if (pressedTab.rightWidget)
        pressedTab.rightWidget->raise();
    if (leftB)
        leftB->raise();
    if (rightB)
        rightB->raise();
    movingTab->setVisible(true);
}